

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int32_t xor_uint16(uint16_t *array_1,int32_t card_1,uint16_t *array_2,int32_t card_2,uint16_t *out)

{
  ushort uVar1;
  ushort uVar2;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  size_t n_elems_1;
  size_t n_elems;
  uint16_t v2;
  uint16_t v1;
  int32_t pos_out;
  int32_t pos2;
  int32_t pos1;
  int local_34;
  int local_30;
  int local_2c;
  
  local_2c = 0;
  local_30 = 0;
  local_34 = 0;
  while (local_2c < in_ESI && local_30 < in_ECX) {
    uVar1 = *(ushort *)(in_RDI + (long)local_2c * 2);
    uVar2 = *(ushort *)(in_RDX + (long)local_30 * 2);
    if (uVar1 == uVar2) {
      local_2c = local_2c + 1;
      local_30 = local_30 + 1;
    }
    else {
      if (uVar1 < uVar2) {
        *(ushort *)(in_R8 + (long)local_34 * 2) = uVar1;
        local_2c = local_2c + 1;
      }
      else {
        *(ushort *)(in_R8 + (long)local_34 * 2) = uVar2;
        local_30 = local_30 + 1;
      }
      local_34 = local_34 + 1;
    }
  }
  if (local_2c < in_ESI) {
    memcpy((void *)(in_R8 + (long)local_34 * 2),(void *)(in_RDI + (long)local_2c * 2),
           (long)(in_ESI - local_2c) << 1);
    local_34 = (in_ESI - local_2c) + local_34;
  }
  else if (local_30 < in_ECX) {
    memcpy((void *)(in_R8 + (long)local_34 * 2),(void *)(in_RDX + (long)local_30 * 2),
           (long)(in_ECX - local_30) << 1);
    local_34 = (in_ECX - local_30) + local_34;
  }
  return local_34;
}

Assistant:

int32_t xor_uint16(const uint16_t *array_1, int32_t card_1,
                   const uint16_t *array_2, int32_t card_2, uint16_t *out) {
    int32_t pos1 = 0, pos2 = 0, pos_out = 0;
    while (pos1 < card_1 && pos2 < card_2) {
        const uint16_t v1 = array_1[pos1];
        const uint16_t v2 = array_2[pos2];
        if (v1 == v2) {
            ++pos1;
            ++pos2;
            continue;
        }
        if (v1 < v2) {
            out[pos_out++] = v1;
            ++pos1;
        } else {
            out[pos_out++] = v2;
            ++pos2;
        }
    }
    if (pos1 < card_1) {
        const size_t n_elems = card_1 - pos1;
        memcpy(out + pos_out, array_1 + pos1, n_elems * sizeof(uint16_t));
        pos_out += (int32_t)n_elems;
    } else if (pos2 < card_2) {
        const size_t n_elems = card_2 - pos2;
        memcpy(out + pos_out, array_2 + pos2, n_elems * sizeof(uint16_t));
        pos_out += (int32_t)n_elems;
    }
    return pos_out;
}